

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void SetWallScroller(int id,int sidechoice,double dx,double dy,EScrollPos Where)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  EScrollPos EVar4;
  uint uVar5;
  DScroller *pDVar6;
  FThinkerCollection *pFVar7;
  size_t index;
  uint local_b4;
  uint i;
  int sidenum;
  FLineIdIterator itr;
  int linenum;
  size_t numcollected;
  FThinkerCollection collect;
  undefined1 local_78 [8];
  TThinkerIterator<DScroller> iterator_1;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  int wallnum;
  DScroller *scroller;
  TThinkerIterator<DScroller> iterator;
  EScrollPos Where_local;
  double dy_local;
  double dx_local;
  int sidechoice_local;
  int id_local;
  
  iterator.super_FThinkerIterator._20_4_ = Where;
  iterator.super_FThinkerIterator._20_4_ = operator&(Where,scw_all);
  if (iterator.super_FThinkerIterator._20_4_ != 0) {
    if ((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) {
      TArray<FThinkerCollection,_FThinkerCollection>::TArray
                ((TArray<FThinkerCollection,_FThinkerCollection> *)
                 &iterator_1.super_FThinkerIterator.m_Stat);
      TThinkerIterator<DScroller>::TThinkerIterator((TThinkerIterator<DScroller> *)local_78,0x20);
      while (collect._0_8_ =
                  TThinkerIterator<DScroller>::Next((TThinkerIterator<DScroller> *)local_78,false),
            (DScroller *)collect._0_8_ != (DScroller *)0x0) {
        numcollected._0_4_ = DScroller::GetWallNum((DScroller *)collect._0_8_);
        if ((((int)numcollected != -1) &&
            (bVar2 = FTagManager::LineHasID(&tagManager,sides[(int)numcollected].linedef,id),
            uVar1 = iterator.super_FThinkerIterator._20_4_, bVar2)) &&
           (((int)(((long)(sides[(int)numcollected].linedef)->sidedef[sidechoice] - (long)sides) /
                  0xc0) == (int)numcollected &&
            (EVar4 = DScroller::GetScrollParts((DScroller *)collect._0_8_), uVar1 == EVar4)))) {
          DScroller::SetRate((DScroller *)collect._0_8_,dx,dy);
          TArray<FThinkerCollection,_FThinkerCollection>::Push
                    ((TArray<FThinkerCollection,_FThinkerCollection> *)
                     &iterator_1.super_FThinkerIterator.m_Stat,(FThinkerCollection *)&numcollected);
        }
      }
      uVar5 = TArray<FThinkerCollection,_FThinkerCollection>::Size
                        ((TArray<FThinkerCollection,_FThinkerCollection> *)
                         &iterator_1.super_FThinkerIterator.m_Stat);
      register0x00000000 = (ulong)uVar5;
      index = (size_t)(uint)id;
      FLineIdIterator::FLineIdIterator((FLineIdIterator *)&i,id);
      while (itr.searchtag = FLineIdIterator::Next((FLineIdIterator *)&i), -1 < itr.searchtag) {
        if (lines[itr.searchtag].sidedef[sidechoice] != (side_t *)0x0) {
          iVar3 = (int)(((long)lines[itr.searchtag].sidedef[sidechoice] - (long)sides) / 0xc0);
          for (local_b4 = 0; local_b4 < stack0xffffffffffffff60; local_b4 = local_b4 + 1) {
            index = (size_t)local_b4;
            pFVar7 = TArray<FThinkerCollection,_FThinkerCollection>::operator[]
                               ((TArray<FThinkerCollection,_FThinkerCollection> *)
                                &iterator_1.super_FThinkerIterator.m_Stat,index);
            if (pFVar7->RefNum == iVar3) break;
          }
          if (local_b4 == stack0xffffffffffffff60) {
            pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,index);
            index = 0;
            DScroller::DScroller
                      (pDVar6,sc_side,dx,dy,-1,iVar3,0,iterator.super_FThinkerIterator._20_4_);
          }
        }
      }
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray
                ((TArray<FThinkerCollection,_FThinkerCollection> *)
                 &iterator_1.super_FThinkerIterator.m_Stat);
    }
    else {
      TThinkerIterator<DScroller>::TThinkerIterator((TThinkerIterator<DScroller> *)&scroller,0x20);
      while (pDVar6 = TThinkerIterator<DScroller>::Next
                                ((TThinkerIterator<DScroller> *)&scroller,false),
            pDVar6 != (DScroller *)0x0) {
        iVar3 = DScroller::GetWallNum(pDVar6);
        if (((-1 < iVar3) &&
            (bVar2 = FTagManager::LineHasID(&tagManager,sides[iVar3].linedef,id),
            uVar1 = iterator.super_FThinkerIterator._20_4_, bVar2)) &&
           (((int)(((long)(sides[iVar3].linedef)->sidedef[sidechoice] - (long)sides) / 0xc0) ==
             iVar3 && (EVar4 = DScroller::GetScrollParts(pDVar6), uVar1 == EVar4)))) {
          (*(pDVar6->super_DThinker).super_DObject._vptr_DObject[4])();
        }
      }
    }
  }
  return;
}

Assistant:

void SetWallScroller (int id, int sidechoice, double dx, double dy, EScrollPos Where)
{
	Where = Where & scw_all;
	if (Where == 0) return;

	if (dx == 0 && dy == 0)
	{
		// Special case: Remove the scroller, because the deltas are both 0.
		TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
		DScroller *scroller;

		while ( (scroller = iterator.Next ()) )
		{
			int wallnum = scroller->GetWallNum ();

			if (wallnum >= 0 && tagManager.LineHasID(sides[wallnum].linedef, id) &&
				int(sides[wallnum].linedef->sidedef[sidechoice] - sides) == wallnum &&
				Where == scroller->GetScrollParts())
			{
				scroller->Destroy ();
			}
		}
	}
	else
	{
		// Find scrollers already attached to the matching walls, and change
		// their rates.
		TArray<FThinkerCollection> Collection;
		{
			TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
			FThinkerCollection collect;

			while ( (collect.Obj = iterator.Next ()) )
			{
				if ((collect.RefNum = ((DScroller *)collect.Obj)->GetWallNum ()) != -1 &&
					tagManager.LineHasID(sides[collect.RefNum].linedef, id) &&
					int(sides[collect.RefNum].linedef->sidedef[sidechoice] - sides) == collect.RefNum &&
					Where == ((DScroller *)collect.Obj)->GetScrollParts())
				{
					((DScroller *)collect.Obj)->SetRate (dx, dy);
					Collection.Push (collect);
				}
			}
		}

		size_t numcollected = Collection.Size ();
		int linenum;

		// Now create scrollers for any walls that don't already have them.
		FLineIdIterator itr(id);
		while ((linenum = itr.Next()) >= 0)
		{
			if (lines[linenum].sidedef[sidechoice] != NULL)
			{
				int sidenum = int(lines[linenum].sidedef[sidechoice] - sides);
				unsigned int i;
				for (i = 0; i < numcollected; i++)
				{
					if (Collection[i].RefNum == sidenum)
						break;
				}
				if (i == numcollected)
				{
					new DScroller (EScroll::sc_side, dx, dy, -1, sidenum, 0, Where);
				}
			}
		}
	}
}